

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argsman_tests.cpp
# Opt level: O0

string * __thiscall
argsman_tests::NoIncludeConfTest::Parse_abi_cxx11_(NoIncludeConfTest *this,char *arg)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  string *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  string *error;
  array<const_char_*,_2UL> argv;
  TestArgsManager test;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_fffffffffffffca8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffcb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcc0;
  Flags *in_stack_fffffffffffffcd0;
  char (*in_stack_fffffffffffffcd8) [13];
  undefined4 in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *in_stack_fffffffffffffce8;
  iterator in_stack_fffffffffffffcf0;
  undefined1 *puVar2;
  size_type in_stack_fffffffffffffcf8;
  string *in_stack_fffffffffffffd60;
  char **in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd74;
  ArgsManager *this_00;
  undefined1 local_278 [40];
  undefined1 local_250 [584];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  TestArgsManager::TestArgsManager((TestArgsManager *)in_stack_fffffffffffffca8);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_(&)[13],_ArgsManager::Flags,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
              *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
             in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_fffffffffffffca8);
  __l._M_len = in_stack_fffffffffffffcf8;
  __l._M_array = in_stack_fffffffffffffcf0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector(in_stack_fffffffffffffce8,__l,
           (allocator_type *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0));
  TestArgsManager::SetupArgs((TestArgsManager *)in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8)
  ;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector(in_stack_fffffffffffffcb8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_fffffffffffffca8);
  puVar2 = local_278;
  puVar1 = local_250;
  do {
    puVar1 = puVar1 + -0x28;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair(in_stack_fffffffffffffca8);
  } while (puVar1 != puVar2);
  this_00 = (ArgsManager *)0x1bb5cc4;
  std::__cxx11::string::string(in_stack_fffffffffffffcc0);
  std::array<const_char_*,_2UL>::size((array<const_char_*,_2UL> *)in_stack_fffffffffffffca8);
  std::array<const_char_*,_2UL>::data((array<const_char_*,_2UL> *)in_stack_fffffffffffffca8);
  ArgsManager::ParseParameters
            (this_00,in_stack_fffffffffffffd74,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
  TestArgsManager::~TestArgsManager((TestArgsManager *)in_stack_fffffffffffffca8);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

std::string Parse(const char* arg)
    {
        TestArgsManager test;
        test.SetupArgs({{"-includeconf", ArgsManager::ALLOW_ANY}});
        std::array argv{"ignored", arg};
        std::string error;
        (void)test.ParseParameters(argv.size(), argv.data(), error);
        return error;
    }